

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  Primitive *prim;
  ulong uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  ulong local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  RayHit *local_1000;
  RayQueryContext *local_ff8;
  long local_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar14 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    aVar5 = (ray->super_RayK<1>).dir.field_0;
    auVar26 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar25 = ZEXT464((uint)fVar3);
    auVar23 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
    auVar33._8_4_ = 0x7fffffff;
    auVar33._0_8_ = 0x7fffffff7fffffff;
    auVar33._12_4_ = 0x7fffffff;
    auVar33 = vandps_avx((undefined1  [16])aVar5,auVar33);
    auVar45._8_4_ = 0x219392ef;
    auVar45._0_8_ = 0x219392ef219392ef;
    auVar45._12_4_ = 0x219392ef;
    auVar33 = vcmpps_avx(auVar33,auVar45,1);
    auVar33 = vblendvps_avx((undefined1  [16])aVar5,auVar45,auVar33);
    auVar45 = vrcpps_avx(auVar33);
    fVar3 = auVar45._0_4_;
    auVar35._0_4_ = auVar33._0_4_ * fVar3;
    fVar10 = auVar45._4_4_;
    auVar35._4_4_ = auVar33._4_4_ * fVar10;
    fVar11 = auVar45._8_4_;
    auVar35._8_4_ = auVar33._8_4_ * fVar11;
    fVar12 = auVar45._12_4_;
    auVar35._12_4_ = auVar33._12_4_ * fVar12;
    auVar46._8_4_ = 0x3f800000;
    auVar46._0_8_ = 0x3f8000003f800000;
    auVar46._12_4_ = 0x3f800000;
    auVar33 = vsubps_avx(auVar46,auVar35);
    auVar36._0_4_ = fVar3 + fVar3 * auVar33._0_4_;
    auVar36._4_4_ = fVar10 + fVar10 * auVar33._4_4_;
    auVar36._8_4_ = fVar11 + fVar11 * auVar33._8_4_;
    auVar36._12_4_ = fVar12 + fVar12 * auVar33._12_4_;
    uVar4 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_f88._4_4_ = uVar4;
    local_f88._0_4_ = uVar4;
    local_f88._8_4_ = uVar4;
    local_f88._12_4_ = uVar4;
    auVar47 = ZEXT1664(local_f88);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_f98._4_4_ = uVar4;
    local_f98._0_4_ = uVar4;
    local_f98._8_4_ = uVar4;
    local_f98._12_4_ = uVar4;
    auVar48 = ZEXT1664(local_f98);
    uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_fa8._4_4_ = uVar4;
    local_fa8._0_4_ = uVar4;
    local_fa8._8_4_ = uVar4;
    local_fa8._12_4_ = uVar4;
    auVar49 = ZEXT1664(local_fa8);
    local_fb8 = vshufps_avx(auVar36,auVar36,0);
    auVar50 = ZEXT1664(local_fb8);
    auVar33 = vmovshdup_avx(auVar36);
    local_fc8 = vshufps_avx(auVar36,auVar36,0x55);
    auVar51 = ZEXT1664(local_fc8);
    auVar45 = vshufpd_avx(auVar36,auVar36,1);
    uVar19 = (ulong)(auVar36._0_4_ < 0.0) << 4;
    local_fd8 = vshufps_avx(auVar36,auVar36,0xaa);
    auVar52 = ZEXT1664(local_fd8);
    uVar20 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x20;
    uVar16 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
    uVar21 = uVar19 ^ 0x10;
    uVar17 = uVar20 ^ 0x10;
    local_fe8 = vshufps_avx(auVar26,auVar26,0);
    auVar53 = ZEXT1664(local_fe8);
    auVar33 = vshufps_avx(auVar23,auVar23,0);
    auVar22 = ZEXT1664(auVar33);
    local_ff8 = context;
    local_1000 = ray;
    local_1020 = uVar19;
    local_1028 = uVar20;
LAB_011ebec1:
    do {
      pauVar13 = pauVar14 + -1;
      pauVar14 = pauVar14 + -1;
      if (*(float *)(*pauVar13 + 8) <= auVar25._0_4_) {
        uVar29 = *(ulong *)*pauVar14;
        while ((uVar29 & 8) == 0) {
          uVar15 = uVar29 & 0xfffffffffffffff0;
          fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar23._4_4_ = fVar3;
          auVar23._0_4_ = fVar3;
          auVar23._8_4_ = fVar3;
          auVar23._12_4_ = fVar3;
          pfVar2 = (float *)(uVar15 + 0x80 + uVar19);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar19);
          auVar26._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar26._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar26._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar26._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar26,auVar47._0_16_);
          auVar27._0_4_ = auVar50._0_4_ * auVar33._0_4_;
          auVar27._4_4_ = auVar50._4_4_ * auVar33._4_4_;
          auVar27._8_4_ = auVar50._8_4_ * auVar33._8_4_;
          auVar27._12_4_ = auVar50._12_4_ * auVar33._12_4_;
          pfVar2 = (float *)(uVar15 + 0x80 + uVar20);
          auVar33 = vmaxps_avx(auVar53._0_16_,auVar27);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar20);
          auVar30._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar30._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar30._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar30._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar26 = vsubps_avx(auVar30,auVar48._0_16_);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar16);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar16);
          auVar37._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar37._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar37._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar37._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar31._0_4_ = auVar51._0_4_ * auVar26._0_4_;
          auVar31._4_4_ = auVar51._4_4_ * auVar26._4_4_;
          auVar31._8_4_ = auVar51._8_4_ * auVar26._8_4_;
          auVar31._12_4_ = auVar51._12_4_ * auVar26._12_4_;
          auVar26 = vsubps_avx(auVar37,auVar49._0_16_);
          auVar38._0_4_ = auVar52._0_4_ * auVar26._0_4_;
          auVar38._4_4_ = auVar52._4_4_ * auVar26._4_4_;
          auVar38._8_4_ = auVar52._8_4_ * auVar26._8_4_;
          auVar38._12_4_ = auVar52._12_4_ * auVar26._12_4_;
          auVar26 = vmaxps_avx(auVar31,auVar38);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar21);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar21);
          auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          local_1018 = vmaxps_avx(auVar33,auVar26);
          auVar33 = vsubps_avx(auVar39,auVar47._0_16_);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar17);
          auVar32._0_4_ = auVar50._0_4_ * auVar33._0_4_;
          auVar32._4_4_ = auVar50._4_4_ * auVar33._4_4_;
          auVar32._8_4_ = auVar50._8_4_ * auVar33._8_4_;
          auVar32._12_4_ = auVar50._12_4_ * auVar33._12_4_;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar17);
          auVar40._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar40._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar40._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar40._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar40,auVar48._0_16_);
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar16 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar16 ^ 0x10));
          auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar41._0_4_ = auVar51._0_4_ * auVar33._0_4_;
          auVar41._4_4_ = auVar51._4_4_ * auVar33._4_4_;
          auVar41._8_4_ = auVar51._8_4_ * auVar33._8_4_;
          auVar41._12_4_ = auVar51._12_4_ * auVar33._12_4_;
          auVar33 = vsubps_avx(auVar42,auVar49._0_16_);
          auVar43._0_4_ = auVar52._0_4_ * auVar33._0_4_;
          auVar43._4_4_ = auVar52._4_4_ * auVar33._4_4_;
          auVar43._8_4_ = auVar52._8_4_ * auVar33._8_4_;
          auVar43._12_4_ = auVar52._12_4_ * auVar33._12_4_;
          auVar33 = vminps_avx(auVar41,auVar43);
          auVar26 = vminps_avx(auVar22._0_16_,auVar32);
          auVar33 = vminps_avx(auVar26,auVar33);
          auVar33 = vcmpps_avx(local_1018,auVar33,2);
          if (((uint)uVar29 & 7) == 6) {
            auVar26 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar23,2);
            auVar23 = vcmpps_avx(auVar23,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
            auVar26 = vandps_avx(auVar26,auVar23);
            auVar33 = vandps_avx(auVar26,auVar33);
          }
          auVar33 = vpslld_avx(auVar33,0x1f);
          uVar18 = vmovmskps_avx(auVar33);
          if (uVar18 == 0) {
            auVar33 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar25 = ZEXT1664(auVar33);
            if (pauVar14 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_011ebec1;
          }
          uVar18 = uVar18 & 0xff;
          lVar9 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar29 = *(ulong *)(uVar15 + lVar9 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            uVar6 = *(uint *)(local_1018 + lVar9 * 4);
            lVar9 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar8 = *(ulong *)(uVar15 + lVar9 * 8);
            uVar7 = *(uint *)(local_1018 + lVar9 * 4);
            uVar18 = uVar18 - 1 & uVar18;
            uVar19 = local_1020;
            uVar20 = local_1028;
            if (uVar18 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*pauVar14 = uVar8;
                *(uint *)(*pauVar14 + 8) = uVar7;
                pauVar14 = pauVar14 + 1;
              }
              else {
                *(ulong *)*pauVar14 = uVar29;
                *(uint *)(*pauVar14 + 8) = uVar6;
                pauVar14 = pauVar14 + 1;
                uVar29 = uVar8;
              }
            }
            else {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = uVar29;
              auVar33 = vpunpcklqdq_avx(auVar24,ZEXT416(uVar6));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar8;
              auVar26 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar7));
              lVar9 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *(ulong *)(uVar15 + lVar9 * 8);
              auVar45 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_1018 + lVar9 * 4)));
              auVar23 = vpcmpgtd_avx(auVar26,auVar33);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar35 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar26,auVar33,auVar35);
                auVar33 = vblendvps_avx(auVar33,auVar26,auVar35);
                auVar26 = vpcmpgtd_avx(auVar45,auVar23);
                auVar35 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar45,auVar23,auVar35);
                auVar23 = vblendvps_avx(auVar23,auVar45,auVar35);
                auVar45 = vpcmpgtd_avx(auVar23,auVar33);
                auVar35 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar23,auVar33,auVar35);
                auVar33 = vblendvps_avx(auVar33,auVar23,auVar35);
                *pauVar14 = auVar33;
                pauVar14[1] = auVar45;
                uVar29 = auVar26._0_8_;
                pauVar14 = pauVar14 + 2;
              }
              else {
                lVar9 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                  }
                }
                auVar44._8_8_ = 0;
                auVar44._0_8_ = *(ulong *)(uVar15 + lVar9 * 8);
                auVar36 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_1018 + lVar9 * 4)));
                auVar35 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar26,auVar33,auVar35);
                auVar33 = vblendvps_avx(auVar33,auVar26,auVar35);
                auVar26 = vpcmpgtd_avx(auVar36,auVar45);
                auVar35 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar36,auVar45,auVar35);
                auVar45 = vblendvps_avx(auVar45,auVar36,auVar35);
                auVar35 = vpcmpgtd_avx(auVar45,auVar33);
                auVar36 = vpshufd_avx(auVar35,0xaa);
                auVar35 = vblendvps_avx(auVar45,auVar33,auVar36);
                auVar33 = vblendvps_avx(auVar33,auVar45,auVar36);
                auVar45 = vpcmpgtd_avx(auVar26,auVar23);
                auVar36 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar26,auVar23,auVar36);
                auVar26 = vblendvps_avx(auVar23,auVar26,auVar36);
                auVar23 = vpcmpgtd_avx(auVar35,auVar26);
                auVar36 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar35,auVar26,auVar36);
                auVar26 = vblendvps_avx(auVar26,auVar35,auVar36);
                *pauVar14 = auVar33;
                pauVar14[1] = auVar26;
                pauVar14[2] = auVar23;
                uVar29 = auVar45._0_8_;
                pauVar14 = pauVar14 + 3;
              }
            }
          }
        }
        local_ff0 = (ulong)((uint)uVar29 & 0xf) - 8;
        if (local_ff0 != 0) {
          prim = (Primitive *)(uVar29 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1MB::intersect(&local_1029,ray,context,prim);
            prim = prim + 1;
            local_ff0 = local_ff0 + -1;
            context = local_ff8;
            ray = local_1000;
          } while (local_ff0 != 0);
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar22 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
        auVar25 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar47 = ZEXT1664(local_f88);
        auVar48 = ZEXT1664(local_f98);
        auVar49 = ZEXT1664(local_fa8);
        auVar50 = ZEXT1664(local_fb8);
        auVar51 = ZEXT1664(local_fc8);
        auVar52 = ZEXT1664(local_fd8);
        auVar53 = ZEXT1664(local_fe8);
        uVar19 = local_1020;
        uVar20 = local_1028;
      }
    } while (pauVar14 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }